

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

void pythonStartElement(void *user_data,xmlChar *name,xmlChar **attrs)

{
  int iVar1;
  PyObject *op;
  long lVar2;
  int local_54;
  PyObject *pPStack_50;
  int type;
  PyObject *result;
  PyObject *attrvalue;
  PyObject *attrname;
  PyObject *dict;
  PyObject *handler;
  int i;
  xmlChar **attrs_local;
  xmlChar *name_local;
  void *user_data_local;
  
  pPStack_50 = (PyObject *)0x0;
  local_54 = 0;
  iVar1 = PyObject_HasAttrString(user_data,"startElement");
  if (iVar1 == 0) {
    iVar1 = PyObject_HasAttrString(user_data,"start");
    if (iVar1 != 0) {
      local_54 = 2;
    }
  }
  else {
    local_54 = 1;
  }
  if (local_54 != 0) {
    if ((attrs == (xmlChar **)0x0) && (local_54 == 1)) {
      _Py_XINCREF((PyObject *)&_Py_NoneStruct);
      attrname = (PyObject *)&_Py_NoneStruct;
    }
    else if (attrs == (xmlChar **)0x0) {
      attrname = (PyObject *)PyDict_New();
    }
    else {
      attrname = (PyObject *)PyDict_New();
      for (handler._4_4_ = 0; attrs[handler._4_4_] != (xmlChar *)0x0;
          handler._4_4_ = handler._4_4_ + 2) {
        op = (PyObject *)PyUnicode_FromString(attrs[handler._4_4_]);
        if (attrs[handler._4_4_ + 1] == (xmlChar *)0x0) {
          _Py_XINCREF((PyObject *)&_Py_NoneStruct);
          result = (PyObject *)&_Py_NoneStruct;
        }
        else {
          result = (PyObject *)PyUnicode_FromString(attrs[handler._4_4_ + 1]);
        }
        PyDict_SetItem(attrname,op,result);
        _Py_DECREF(op);
        _Py_DECREF(result);
      }
    }
    if (local_54 == 1) {
      pPStack_50 = (PyObject *)
                   _PyObject_CallMethod_SizeT(user_data,"startElement","sO",name,attrname);
    }
    else if (local_54 == 2) {
      pPStack_50 = (PyObject *)_PyObject_CallMethod_SizeT(user_data,"start","sO",name,attrname);
    }
    lVar2 = PyErr_Occurred();
    if (lVar2 != 0) {
      PyErr_Print();
    }
    _Py_XDECREF(attrname);
    _Py_XDECREF(pPStack_50);
  }
  return;
}

Assistant:

static void
pythonStartElement(void *user_data, const xmlChar * name,
                   const xmlChar ** attrs)
{
    int i;
    PyObject *handler;
    PyObject *dict;
    PyObject *attrname;
    PyObject *attrvalue;
    PyObject *result = NULL;
    int type = 0;

#ifdef DEBUG_SAX
    printf("pythonStartElement(%s) called\n", name);
#endif
    handler = (PyObject *) user_data;
    if (PyObject_HasAttrString(handler, (char *) "startElement"))
        type = 1;
    else if (PyObject_HasAttrString(handler, (char *) "start"))
        type = 2;
    if (type != 0) {
        /*
         * the xmllib interface always generates a dictionary,
         * possibly empty
         */
        if ((attrs == NULL) && (type == 1)) {
            Py_XINCREF(Py_None);
            dict = Py_None;
        } else if (attrs == NULL) {
            dict = PyDict_New();
        } else {
            dict = PyDict_New();
            for (i = 0; attrs[i] != NULL; i++) {
                attrname = PY_IMPORT_STRING((char *) attrs[i]);
                i++;
                if (attrs[i] != NULL) {
                    attrvalue = PY_IMPORT_STRING((char *) attrs[i]);
                } else {
                    Py_XINCREF(Py_None);
                    attrvalue = Py_None;
                }
                PyDict_SetItem(dict, attrname, attrvalue);
		Py_DECREF(attrname);
		Py_DECREF(attrvalue);
            }
        }

        if (type == 1)
            result = PyObject_CallMethod(handler, (char *) "startElement",
                                         (char *) "sO", name, dict);
        else if (type == 2)
            result = PyObject_CallMethod(handler, (char *) "start",
                                         (char *) "sO", name, dict);
        if (PyErr_Occurred())
            PyErr_Print();
        Py_XDECREF(dict);
        Py_XDECREF(result);
    }
}